

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array.cpp
# Opt level: O3

void __thiscall Omega_h::HostRead<long>::HostRead(HostRead<long> *this,Read<signed_char> *read)

{
  Alloc *pAVar1;
  ScopedTimer timer;
  ScopedTimer local_11;
  
  pAVar1 = (read->write_).shared_alloc_.alloc;
  (this->read_).write_.shared_alloc_.alloc = pAVar1;
  if (((ulong)pAVar1 & 7) == 0 && pAVar1 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      (this->read_).write_.shared_alloc_.alloc = (Alloc *)(pAVar1->size * 8 + 1);
    }
    else {
      pAVar1->use_count = pAVar1->use_count + 1;
    }
  }
  (this->read_).write_.shared_alloc_.direct_ptr = (read->write_).shared_alloc_.direct_ptr;
  begin_code("array device to host",(char *)0x0);
  ScopedTimer::~ScopedTimer(&local_11);
  return;
}

Assistant:

HostRead<T>::HostRead(Read<T> read) : read_(read) {
  ScopedTimer timer("array device to host");
#ifdef OMEGA_H_USE_KOKKOS
  Kokkos::View<const T*> dev_view = read.view();
  Kokkos::View<const T*, Kokkos::HostSpace> h_view =
      Kokkos::create_mirror_view_and_copy(Kokkos::HostSpace(), read.view());
  mirror_ = h_view;
#elif defined(OMEGA_H_USE_CUDA)
  mirror_.reset(new T[std::size_t(read_.size())]);
  auto const err = cudaMemcpy(mirror_.get(), read_.data(),
      std::size_t(size()) * sizeof(T), cudaMemcpyDeviceToHost);
  OMEGA_H_CHECK(err == cudaSuccess);
#endif
}